

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

void chaiscript::Boxed_Number::check_type<double,long_long>(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__bad_cast_004a2090;
  __cxa_throw(puVar1,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static void check_type() {
#ifdef CHAISCRIPT_MSVC
// MSVC complains about this being redundant / tautologica l
#pragma warning(push)
#pragma warning(disable : 4127 6287)
#endif
      if (sizeof(Source) != sizeof(Target) || std::is_signed<Source>() != std::is_signed<Target>()
          || std::is_floating_point<Source>() != std::is_floating_point<Target>()) {
        throw chaiscript::detail::exception::bad_any_cast();
      }
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif
    }